

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O0

void __thiscall
ConvertAddrCommand::execute(ConvertAddrCommand *this,CmdParams *params,CmdContext *context)

{
  _Setw _Var1;
  ostream *poVar2;
  addr_type type;
  addr_type type_00;
  string local_88;
  string local_58;
  ulong local_38;
  offset_t outOffset;
  offset_t offset;
  Executable *exe;
  CmdContext *context_local;
  CmdParams *params_local;
  ConvertAddrCommand *this_local;
  
  exe = (Executable *)context;
  context_local = (CmdContext *)params;
  params_local = (CmdParams *)this;
  offset = (offset_t)cmd_util::getExeFromContext(context);
  outOffset = cmd_util::readOffset(this->addrFrom);
  local_38 = (**(code **)(*(long *)offset + 0xb8))(offset,outOffset,this->addrFrom,this->addrTo);
  if (local_38 == 0xffffffffffffffff) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[WARNING] This address cannot be mapped");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"[");
    cmd_util::addrTypeToStr_abi_cxx11_(&local_58,(cmd_util *)(ulong)this->addrFrom,type);
    poVar2 = std::operator<<(poVar2,(string *)&local_58);
    poVar2 = std::operator<<(poVar2,"]");
    poVar2 = std::operator<<(poVar2,"\t->\t");
    poVar2 = std::operator<<(poVar2,"[");
    cmd_util::addrTypeToStr_abi_cxx11_(&local_88,(cmd_util *)(ulong)this->addrTo,type_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_88);
    poVar2 = std::operator<<(poVar2,"]");
    std::operator<<(poVar2,":\n");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_58);
    std::ios::fill((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    poVar2 = std::operator<<((ostream *)&std::cout,"[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    _Var1 = std::setw(8);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,outOffset);
    std::operator<<(poVar2,"]");
    std::operator<<((ostream *)&std::cout,"\t->\t");
    std::ios::fill((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    poVar2 = std::operator<<((ostream *)&std::cout,"[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    _Var1 = std::setw(8);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
    std::operator<<(poVar2,"]");
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ConvertAddrCommand::execute(CmdParams *params, CmdContext  *context)
{
    Executable *exe = cmd_util::getExeFromContext(context);
    offset_t offset = cmd_util::readOffset(addrFrom);

    offset_t outOffset = exe->convertAddr(offset, addrFrom, addrTo);
    if (outOffset == INVALID_ADDR) {
        std::cout << "[WARNING] This address cannot be mapped" << std::endl;
        return;
    }
    std::cout << "[" << cmd_util::addrTypeToStr(addrFrom) << "]"
    	<< "\t->\t"
    	<< "[" << cmd_util::addrTypeToStr(addrTo) << "]"
    	<< ":\n";
    OUT_PADDED_OFFSET(std::cout, offset);
    std::cout << "\t->\t";
    OUT_PADDED_OFFSET(std::cout, outOffset);
    std::cout << std::endl;
}